

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O0

int generate_digits(Fp *fp,Fp *upper,Fp *lower,char *digits,int *K)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  uint64_t kappa_00;
  ulong uVar4;
  ulong uVar5;
  char *in_RCX;
  long *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  int *in_R8;
  uint digit_1;
  uint64_t *unit;
  uint64_t tmp;
  uint digit;
  uint64_t div;
  uint64_t *divp;
  int kappa;
  int idx;
  uint64_t part2;
  uint64_t part1;
  Fp one;
  uint64_t delta;
  uint64_t wfrac;
  uint64_t *local_90;
  ulong *local_70;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  ulong local_40;
  
  uVar1 = *in_RSI;
  lVar2 = *in_RDI;
  local_40 = *in_RSI - *in_RDX;
  kappa_00 = 1L << (-(char)(int)in_RSI[1] & 0x3fU);
  cVar3 = (char)(int)in_RSI[1];
  local_58 = *in_RSI >> (-cVar3 & 0x3fU);
  local_60 = *in_RSI & kappa_00 - 1;
  local_64 = 0;
  local_68 = 10;
  local_70 = tens + 10;
  while( true ) {
    if (local_68 < 1) {
      local_90 = tens + 0x12;
      while( true ) {
        local_40 = local_40 * 10;
        local_68 = local_68 + -1;
        uVar5 = local_60 * 10 >> (-cVar3 & 0x3fU);
        if (((int)uVar5 != 0) || (local_64 != 0)) {
          in_RCX[local_64] = (char)uVar5 + '0';
          local_64 = local_64 + 1;
        }
        local_60 = kappa_00 - 1 & local_60 * 10;
        if (local_60 < local_40) break;
        local_90 = local_90 + -1;
      }
      *in_R8 = local_68 + *in_R8;
      round_digit(in_RCX,local_64,local_40,local_60,kappa_00,(uVar1 - lVar2) * *local_90);
      return local_64;
    }
    uVar5 = *local_70;
    uVar4 = local_58 / uVar5;
    if (((int)uVar4 != 0) || (local_64 != 0)) {
      in_RCX[local_64] = (char)uVar4 + '0';
      local_64 = local_64 + 1;
    }
    local_58 = local_58 - (uVar4 & 0xffffffff) * uVar5;
    local_68 = local_68 + -1;
    uVar4 = (local_58 << (-cVar3 & 0x3fU)) + local_60;
    if (uVar4 <= local_40) break;
    local_70 = local_70 + 1;
  }
  *in_R8 = local_68 + *in_R8;
  round_digit(in_RCX,local_64,local_40,uVar4,uVar5 << (-cVar3 & 0x3fU),uVar1 - lVar2);
  return local_64;
}

Assistant:

static int generate_digits(Fp* fp, Fp* upper, Fp* lower, char* digits, int* K)
{
    uint64_t wfrac = upper->frac - fp->frac;
    uint64_t delta = upper->frac - lower->frac;

    Fp one;
    one.frac = 1ULL << -upper->exp;
    one.exp  = upper->exp;

    uint64_t part1 = upper->frac >> -one.exp;
    uint64_t part2 = upper->frac & (one.frac - 1);

    int idx = 0, kappa = 10;
    uint64_t* divp;
    /* 1000000000 */
    for(divp = tens + 10; kappa > 0; divp++) {

        uint64_t div = *divp;
        unsigned digit = part1 / div;

        if (digit || idx) {
            digits[idx++] = digit + '0';
        }

        part1 -= digit * div;
        kappa--;

        uint64_t tmp = (part1 <<-one.exp) + part2;
        if (tmp <= delta) {
            *K += kappa;
            round_digit(digits, idx, delta, tmp, div << -one.exp, wfrac);

            return idx;
        }
    }

    /* 10 */
    uint64_t* unit = tens + 18;

    while(true) {
        part2 *= 10;
        delta *= 10;
        kappa--;

        unsigned digit = part2 >> -one.exp;
        if (digit || idx) {
            digits[idx++] = digit + '0';
        }

        part2 &= one.frac - 1;
        if (part2 < delta) {
            *K += kappa;
            round_digit(digits, idx, delta, part2, one.frac, wfrac * *unit);

            return idx;
        }

        unit--;
    }
}